

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor-xor-rle-per-draw-list-with-vtx-offset.cpp
# Opt level: O2

bool __thiscall
ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::setDrawData
          (XorRlePerDrawListWithVtxOffset *this,ImDrawData *drawData)

{
  DrawLists *__x;
  DrawListsDiff *this_00;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bVar1;
  pointer pcVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  unsigned_short *__first;
  ImDrawCmd *pIVar5;
  long lVar6;
  uint32_t uVar7;
  long lVar8;
  pointer pvVar9;
  XorRlePerDrawListWithVtxOffset *pXVar10;
  vector<char,_std::allocator<char>_> *pvVar11;
  pointer pvVar12;
  uint uVar13;
  int i;
  uint32_t iCmd;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t nCmd;
  uint32_t c;
  float offsetX;
  uint32_t nVertices;
  float offsetY;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_78;
  uint local_70;
  uint32_t offsetVtx;
  uint32_t textureId;
  uint32_t nElements;
  ImDrawData *local_60;
  vector<char,_std::allocator<char>_> *local_58;
  XorRlePerDrawListWithVtxOffset *local_50;
  DrawLists *local_48;
  DrawLists *local_40;
  vector<char,_std::allocator<char>_> *local_38;
  
  __x = &(this->super_Interface).m_drawListsCur;
  local_40 = &(this->super_Interface).m_drawListsPrev;
  local_50 = this;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator=(local_40,__x);
  local_58 = (vector<char,_std::allocator<char>_> *)(ulong)(uint)drawData->CmdListsCount;
  local_60 = drawData;
  local_48 = __x;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(__x,(size_type)local_58);
  pvVar11 = (vector<char,_std::allocator<char>_> *)0x0;
  while (pXVar10 = local_50, pvVar11 != local_58) {
    pvVar9 = (local_48->
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar1.container = pvVar9 + (long)pvVar11;
    pcVar2 = pvVar9[(long)pvVar11].super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar9[(long)pvVar11].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data + 8) != pcVar2) {
      ((bVar1.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_finish = pcVar2;
    }
    pIVar3 = local_60->CmdLists[(long)pvVar11];
    pIVar4 = (pIVar3->VtxBuffer).Data;
    offsetX = (pIVar4->pos).x;
    offsetY = (pIVar4->pos).y;
    local_78.container = pvVar11;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)&offsetX,(char *)&nVertices,bVar1);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)&offsetY,(char *)&local_78,bVar1);
    nVertices = (pIVar3->VtxBuffer).Size;
    for (lVar8 = 0; (ulong)nVertices * 0x14 - lVar8 != 0; lVar8 = lVar8 + 0x14) {
      pIVar4 = (pIVar3->VtxBuffer).Data;
      *(float *)((long)&(pIVar4->pos).x + lVar8) =
           *(float *)((long)&(pIVar4->pos).x + lVar8) - offsetX;
      *(float *)((long)&(pIVar4->pos).y + lVar8) =
           *(float *)((long)&(pIVar4->pos).y + lVar8) - offsetY;
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)&nVertices,(char *)&offsetY,bVar1);
    pIVar4 = (pIVar3->VtxBuffer).Data;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)pIVar4,(char *)(pIVar4 + nVertices),bVar1);
    for (lVar8 = 0; (ulong)nVertices * 0x14 - lVar8 != 0; lVar8 = lVar8 + 0x14) {
      pIVar4 = (pIVar3->VtxBuffer).Data;
      *(float *)((long)&(pIVar4->pos).x + lVar8) =
           offsetX + *(float *)((long)&(pIVar4->pos).x + lVar8);
      *(float *)((long)&(pIVar4->pos).y + lVar8) =
           offsetY + *(float *)((long)&(pIVar4->pos).y + lVar8);
    }
    uVar14 = (pIVar3->IdxBuffer).Size;
    c = (uVar14 & 1) + uVar14;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)&c,(char *)&offsetX,bVar1);
    __first = (pIVar3->IdxBuffer).Data;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)__first,(char *)(__first + uVar14),bVar1);
    if ((uVar14 & 1) != 0) {
      nCmd = nCmd & 0xffff0000;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&nCmd,(char *)((long)&nCmd + 2),bVar1);
    }
    nCmd = (pIVar3->CmdBuffer).Size;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)&nCmd,(char *)&c,bVar1);
    for (uVar14 = 0; uVar14 < nCmd; uVar14 = uVar14 + 1) {
      pIVar5 = (pIVar3->CmdBuffer).Data;
      nElements = pIVar5[(int)uVar14].ElemCount;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&nElements,(char *)&local_60,bVar1);
      textureId = *(uint32_t *)&pIVar5[(int)uVar14].TextureId;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&textureId,(char *)&nElements,bVar1);
      offsetVtx = pIVar5[(int)uVar14].VtxOffset;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&offsetVtx,(char *)&textureId,bVar1);
      local_70 = pIVar5[(int)uVar14].IdxOffset;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&local_70,(char *)&offsetVtx,bVar1);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)(pIVar5 + (int)uVar14),(char *)&pIVar5[(int)uVar14].TextureId,bVar1);
    }
    pvVar11 = (vector<char,_std::allocator<char>_> *)
              ((long)&((local_78.container)->super__Vector_base<char,_std::allocator<char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1);
  }
  this_00 = &(local_50->super_Interface).m_drawListsDiff;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::clear(this_00);
  local_60 = (ImDrawData *)this_00;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize(this_00,(size_type)local_58);
  for (pvVar11 = (vector<char,_std::allocator<char>_> *)0x0; pvVar11 != local_58;
      pvVar11 = (vector<char,_std::allocator<char>_> *)
                ((long)&(pvVar11->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1)) {
    pvVar12 = (local_48->
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + (long)pvVar11;
    pvVar9 = (((_Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)&local_60->Valid)->_M_impl).super__Vector_impl_data._M_start;
    local_78.container = pvVar9 + (long)pvVar11;
    pcVar2 = pvVar9[(long)pvVar11].super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar9[(long)pvVar11].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data + 8) != pcVar2) {
      ((local_78.container)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
      super__Vector_impl_data._M_finish = pcVar2;
    }
    offsetX = 1.4013e-45;
    pvVar9 = (pXVar10->super_Interface).m_drawListsPrev.
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((vector<char,_std::allocator<char>_> *)
         (((long)(pXVar10->super_Interface).m_drawListsPrev.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9) / 0x18) <= pvVar11) ||
       ((long)*(pointer *)
               ((long)&pvVar9[(long)pvVar11].super__Vector_base<char,_std::allocator<char>_>._M_impl
                       .super__Vector_impl_data + 8) -
        *(long *)&pvVar9[(long)pvVar11].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data !=
        (long)*(pointer *)
               ((long)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data + 8) -
        *(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data)) {
      offsetX = 0.0;
    }
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((char *)&offsetX,(char *)&nVertices,local_78);
    if (offsetX == 1.4013e-45) {
      pvVar9 = (local_40->
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + (long)pvVar11;
      c = 0;
      nCmd = 0;
      lVar8 = 0;
      uVar14 = 0;
      local_38 = pvVar11;
      while( true ) {
        bVar1.container = local_78.container;
        uVar7 = nCmd;
        lVar6 = *(long *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data;
        uVar15 = (long)*(pointer *)
                        ((long)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data + 8) - lVar6;
        uVar13 = (uint)uVar15;
        if ((int)uVar13 <= lVar8) break;
        uVar13 = *(uint *)(lVar6 + lVar8) ^
                 *(uint *)(*(long *)&(pvVar9->super__Vector_base<char,_std::allocator<char>_>).
                                     _M_impl.super__Vector_impl_data + lVar8);
        if (uVar13 == uVar14) {
          nCmd = nCmd + 1;
        }
        else {
          if (nCmd != 0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&nCmd,(char *)&c,local_78);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&c,(char *)&offsetX,bVar1);
          }
          nCmd = 1;
          c = uVar13;
        }
        lVar8 = lVar8 + 4;
        uVar14 = uVar13;
      }
      uVar15 = uVar15 & 3;
      if (uVar15 != 0) {
        offsetY = 0.0;
        nVertices = 0;
        uVar16 = (ulong)(uVar13 & 0xfffffffc);
        memcpy(&offsetY,(void *)(*(long *)&(pvVar9->super__Vector_base<char,_std::allocator<char>_>)
                                           ._M_impl.super__Vector_impl_data + uVar16),uVar15);
        memcpy(&nVertices,(void *)(lVar6 + uVar16),uVar15);
        bVar1.container = local_78.container;
        uVar13 = nVertices ^ (uint)offsetY;
        if (uVar13 == uVar14) {
          nCmd = uVar7 + 1;
        }
        else {
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&nCmd,(char *)&c,local_78);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&c,(char *)&offsetX,bVar1);
          nCmd = 1;
          c = uVar13;
        }
      }
      bVar1.container = local_78.container;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&nCmd,(char *)&c,local_78);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&c,(char *)&offsetX,bVar1);
      pXVar10 = local_50;
      pvVar11 = local_38;
    }
    else if (offsetX == 0.0) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data + 8),local_78);
    }
  }
  return true;
}

Assistant:

bool XorRlePerDrawListWithVtxOffset::setDrawData(const ::ImDrawData * drawData) {
    m_drawListsPrev = m_drawListsCur;

    uint32_t nCmdLists = drawData->CmdListsCount;
    m_drawListsCur.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; iList++) {
        m_drawListsCur[iList].clear();
        ::writeCmdListToBuffer(drawData->CmdLists[iList], m_drawListsCur[iList]);
    }

    // calculate diff

    m_drawListsDiff.clear();
    m_drawListsDiff.resize(nCmdLists);

    for (uint32_t iList = 0; iList < nCmdLists; ++iList) {
        auto & bufferCur = m_drawListsCur[iList];
        auto & bufferDiff = m_drawListsDiff[iList];

        bufferDiff.clear();

        int32_t type = 1; // Run-Length Encoding
        if (iList >= m_drawListsPrev.size() || m_drawListsPrev[iList].size() != bufferCur.size()) {
            type = 0; // Full update
        }

        std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(bufferDiff));

        if (type == 0) {
            std::copy(bufferCur.begin(), bufferCur.end(), std::back_inserter(bufferDiff));
        } else if (type == 1) {
            auto & bufferPrev = m_drawListsPrev[iList];

            uint32_t a = 0;
            uint32_t b = 0;
            uint32_t c = 0;
            uint32_t n = 0;

            for (int i = 0; i < (int) bufferCur.size(); i += 4) {
                std::memcpy((char *)(&a), bufferPrev.data() + i, sizeof(uint32_t));
                std::memcpy((char *)(&b), bufferCur.data() + i, sizeof(uint32_t));
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    if (n > 0) {
                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    }
                    n = 1;
                    c = a;
                }
            }

            if (bufferCur.size() % 4 != 0) {
                a = 0;
                b = 0;
                uint32_t i = (bufferCur.size()/4)*4;
                uint32_t k = bufferCur.size() - i;
                std::memcpy((char *)(&a), bufferPrev.data() + i, k);
                std::memcpy((char *)(&b), bufferCur.data() + i, k);
                a = a ^ b;
                if (a == c) {
                    ++n;
                } else {
                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
                    n = 1;
                    c = a;
                }
            }

            std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(bufferDiff));
            std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(bufferDiff));
        }
    }

    return true;
}